

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * google::protobuf::strings::CHexEscape(string *__return_storage_ptr__,string *src)

{
  int src_len;
  int iVar1;
  int iVar2;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> dest_00;
  LogMessage *other;
  LogFinisher local_69;
  unique_ptr<char[],_std::default_delete<char[]>_> dest;
  LogMessage local_60;
  
  src_len = (int)src->_M_string_length;
  iVar2 = src_len * 4 + 1;
  iVar1 = -1;
  if (-1 < src_len * 4) {
    iVar1 = iVar2;
  }
  dest_00._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)operator_new__((long)iVar1);
  dest._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 dest_00._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  iVar2 = CEscapeInternal((src->_M_dataplus)._M_p,src_len,
                          (char *)dest_00._M_t.
                                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                  super__Head_base<0UL,_char_*,_false>._M_head_impl,iVar2,true,false
                         );
  if (iVar2 < 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x269);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (len) >= (0): ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_60);
    dest_00._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (tuple<char_*,_std::default_delete<char[]>_>)dest;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             dest_00._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl,
             (char *)((long)iVar2 +
                     (long)dest_00._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                           .super__Head_base<0UL,_char_*,_false>._M_head_impl));
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&dest);
  return __return_storage_ptr__;
}

Assistant:

std::string CHexEscape(const std::string &src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  std::unique_ptr<char[]> dest(new char[dest_length]);
  const int len = CEscapeInternal(src.data(), src.size(),
                                  dest.get(), dest_length, true, false);
  GOOGLE_DCHECK_GE(len, 0);
  return std::string(dest.get(), len);
}